

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

QPointF __thiscall
QGraphicsProxyWidgetPrivate::mapToReceiver
          (QGraphicsProxyWidgetPrivate *this,QPointF *pos,QWidget *receiver)

{
  QPointF QVar1;
  QWidget *in_RDX;
  qreal *in_RSI;
  long in_FS_OFFSET;
  QPointF p;
  QPoint *in_stack_ffffffffffffff98;
  QPointF *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  bool bVar2;
  QPointF local_30;
  QWidget *local_20;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.xp = *in_RSI;
  local_18.yp = in_RSI[1];
  local_20 = in_RDX;
  while( true ) {
    bVar2 = false;
    if (local_20 != (QWidget *)0x0) {
      bVar2 = ::operator!=((QWidget **)in_stack_ffffffffffffffa0,
                           (QPointer<QWidget> *)in_stack_ffffffffffffff98);
    }
    if (bVar2 == false) break;
    QWidget::pos((QWidget *)CONCAT17(bVar2,in_stack_ffffffffffffffa8));
    QPointF::QPointF(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QPointF::operator-=(&local_18,&local_30);
    local_20 = QWidget::parentWidget((QWidget *)0x9b8fa6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1.yp = local_18.yp;
    QVar1.xp = local_18.xp;
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QPointF QGraphicsProxyWidgetPrivate::mapToReceiver(const QPointF &pos, const QWidget *receiver) const
{
    QPointF p = pos;
    // Map event position from us to the receiver, preserving its
    // precision (don't use QWidget::mapFrom here).
    while (receiver && receiver != widget) {
        p -= QPointF(receiver->pos());
        receiver = receiver->parentWidget();
    }
    return p;
}